

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(char lhs,SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar2;
  undefined8 in_RAX;
  undefined1 in_SIL;
  undefined1 in_DIL;
  undefined5 unaff_retaddr;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  undefined8 uVar3;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *result_00;
  
  uVar3 = CONCAT26(CONCAT11((char)((ulong)in_RAX >> 0x38),in_SIL),CONCAT15(in_DIL,(int5)in_RAX));
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xffffffffffffffff);
  result_00 = (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
              CONCAT35((int3)((ulong)uVar3 >> 0x28),
                       CONCAT14((char)((ulong)uVar3 >> 0x30),(int)uVar3));
  bVar1 = ModulusSimpleCaseHelper<signed_char,_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::ModulusSimpleCase(lhs,rhs,result_00);
  if (!bVar1) {
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xfffffffffffffffa,&stack0xfffffffffffffffd);
    SafeInt::operator_cast_to_signed_char
              ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT17(result.m_int,CONCAT16(rhs.m_int,CONCAT15(lhs,unaff_retaddr))));
    SVar2 = SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       result_00,'\0');
    result_00 = (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                CONCAT44((int)((ulong)result_00 >> 0x20),CONCAT13(SVar2.m_int,(int3)result_00));
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT17(result.m_int,CONCAT16(rhs.m_int,CONCAT15(lhs,unaff_retaddr))),
               (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)result_00);
  }
  return (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         (char)((ulong)result_00 >> 0x38);
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}